

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O0

int createCellConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  reference this;
  reference local_38;
  int local_24;
  int local_20;
  int index;
  int n;
  int column;
  int row;
  int header_local;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *coverMatrix_local;
  
  column = header;
  _row = coverMatrix;
  for (n = 1; n < 10; n = n + 1) {
    for (index = 1; index < 10; index = index + 1) {
      for (local_20 = 1; local_20 < 10; local_20 = local_20 + 1) {
        local_24 = indexInCoverMatrix(n,index,local_20);
        this = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[](_row,(long)local_24);
        local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(long)column);
        std::_Bit_reference::operator=(&local_38,true);
      }
      column = column + 1;
    }
  }
  return column;
}

Assistant:

int createCellConstraints(vector<vector<bool>> &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row++) {
        for (int column = COVER_START_INDEX; column <= SIZE; column++, header++) {
            for (int n = COVER_START_INDEX; n <= SIZE; n++) {
                int index = indexInCoverMatrix(row, column, n);
                
            coverMatrix[index][header] = true;

            }
        }
    }
    return header;
}